

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O1

float32 propagateFloat32NaN(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = 2;
  bVar5 = 2;
  if (0x7f800000 < (a & 0x7fffffff)) {
    bVar5 = ((a & 0x3fffff) == 0 || (a & 0x7fc00000) != 0x7f800000) ^ 5;
  }
  if (0x7f800000 < (b & 0x7fffffff)) {
    bVar4 = ((b & 0x3fffff) == 0 || (b & 0x7fc00000) != 0x7f800000) ^ 5;
  }
  if ((bVar5 == 5) || (bVar4 == 5)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode != '\0') {
    return 0x7fc00000;
  }
  bVar2 = a * 2 < b * 2 || b <= a && a * 2 <= b * 2;
  if (bVar5 == 4) {
    if (bVar4 == 5) goto LAB_00d00406;
    bVar1 = bVar4 == 4 && bVar2;
  }
  else {
    if (bVar5 != 5) goto LAB_00d003f8;
    bVar1 = bVar4 == 4;
    if (bVar4 == 5) {
      bVar1 = bVar2;
    }
  }
  if (!bVar1) {
LAB_00d00406:
    uVar3 = a | 0x400000;
    if (bVar5 != 5) {
      uVar3 = a;
    }
    return uVar3;
  }
LAB_00d003f8:
  uVar3 = b | 0x400000;
  if (bVar4 != 5) {
    uVar3 = b;
  }
  return uVar3;
}

Assistant:

static inline int float32_is_any_nan(float32 a)
{
    return ((float32_val(a) & ~(1 << 31)) > 0x7f800000UL);
}